

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass-utils.h
# Opt level: O0

void __thiscall
wasm::PassUtils::FilteredPassRunner::doAdd
          (FilteredPassRunner *this,unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *pass)

{
  unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> local_28;
  unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> local_20;
  unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *local_18;
  unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *pass_local;
  FilteredPassRunner *this_local;
  
  local_18 = pass;
  pass_local = (unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *)this;
  std::
  make_unique<wasm::PassUtils::FilteredPass,std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>,std::unordered_set<wasm::Function*,std::hash<wasm::Function*>,std::equal_to<wasm::Function*>,std::allocator<wasm::Function*>>const&>
            (&local_28,
             (unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
              *)pass);
  std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>::
  unique_ptr<wasm::PassUtils::FilteredPass,std::default_delete<wasm::PassUtils::FilteredPass>,void>
            ((unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>> *)&local_20,
             (unique_ptr<wasm::PassUtils::FilteredPass,_std::default_delete<wasm::PassUtils::FilteredPass>_>
              *)&local_28);
  PassRunner::doAdd(&this->super_PassRunner,&local_20);
  std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>::~unique_ptr(&local_20);
  std::
  unique_ptr<wasm::PassUtils::FilteredPass,_std::default_delete<wasm::PassUtils::FilteredPass>_>::
  ~unique_ptr((unique_ptr<wasm::PassUtils::FilteredPass,_std::default_delete<wasm::PassUtils::FilteredPass>_>
               *)&local_28);
  return;
}

Assistant:

void doAdd(std::unique_ptr<Pass> pass) override {
    PassRunner::doAdd(
      std::make_unique<FilteredPass>(std::move(pass), relevantFuncs));
  }